

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O2

bool __thiscall
wasm::ShellExternalInterface::growMemory
          (ShellExternalInterface *this,Name memoryName,Address param_2,Address newSize)

{
  iterator iVar1;
  undefined1 local_30 [8];
  Name memoryName_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  local_30 = memoryName.super_IString.str._M_len;
  if (newSize.addr < 0x40000001) {
    iVar1 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
            ::find(&(this->memories)._M_t,(key_type *)local_30);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->memories)._M_t._M_impl.super__Rb_tree_header) {
      (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
                (this,"growMemory on non-existing memory");
    }
    Memory::resize((Memory *)&iVar1._M_node[1]._M_left,newSize.addr);
  }
  return newSize.addr < 0x40000001;
}

Assistant:

bool
  growMemory(Name memoryName, Address /*oldSize*/, Address newSize) override {
    // Apply a reasonable limit on memory size, 1GB, to avoid DOS on the
    // interpreter.
    if (newSize > 1024 * 1024 * 1024) {
      return false;
    }
    auto it = memories.find(memoryName);
    if (it == memories.end()) {
      trap("growMemory on non-existing memory");
    }
    auto& memory = it->second;
    memory.resize(newSize);
    return true;
  }